

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_reserve_failure_noMemoryAvailable_fn(int _i)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  size_t *psVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  long lVar10;
  size_t local_68;
  char *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  private_ACUtilsTest_ADynArray_CharArray array;
  
  array.buffer = (char *)0x0;
  array.reallocator._0_4_ = 0x10a480;
  array.reallocator._4_4_ = 0;
  array.deallocator._0_4_ = 0x10a4c0;
  array.deallocator._4_4_ = 0;
  array.size = 8;
  array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  array.capacity = 8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x10ba9f;
  array.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  if (array.size != 1) {
    uVar2 = 0;
    do {
      array.buffer[uVar2] = '5';
      uVar2 = uVar2 + 1;
    } while (uVar2 < array.size - 1);
  }
  array.buffer[array.size - 1] = '0';
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 1;
  uStack_50 = 0x10baf7;
  bVar1 = private_ACUtils_ADynArray_reserve(&array,0x20,false,1);
  if (bVar1 != false) {
    local_68 = (size_t)bVar1;
    psVar5 = &local_68;
    local_60 = "false";
    pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar7 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax, false, sizeof(*(&array)->buffer)) == false"
    ;
    pcVar8 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax, false, sizeof(*(&array)->buffer))"
    ;
    iVar6 = 0x126;
    goto LAB_0010bd82;
  }
  uStack_50 = 0x10bb10;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x126);
  if (array.size == 8) {
    uStack_50 = 0x10bb30;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x127);
    if (array.capacity == 8) {
      uStack_50 = 0x10bb50;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x128);
      if (array.buffer == (char *)0x0) {
        psVar5 = &local_58;
        pcVar4 = "Assertion \'_ck_x != NULL\' failed";
        pcVar3 = "Assertion \'%s\' failed: %s == %#x";
        pcVar7 = "(void*) array.buffer != NULL";
        pcVar8 = "(void*) array.buffer";
        iVar6 = 0x129;
LAB_0010bd82:
        uStack_50 = 0;
        local_58 = 0;
        *(code **)((long)psVar5 + -8) = test_ADynArray_reserve_failure_growStrategyNull_fn;
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,iVar6,pcVar4,pcVar3,pcVar7,pcVar8);
      }
      uStack_50 = 0x10bb70;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x129);
      lVar10 = 0;
      do {
        sVar9 = (size_t)array.buffer[lVar10];
        if (sVar9 != 0x35) {
          local_60 = "\'5\'";
          pcVar7 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
          pcVar3 = "array.buffer[i] == \'5\'";
          pcVar4 = "array.buffer[i]";
          iVar6 = 299;
          local_58 = 0x35;
          goto LAB_0010bc21;
        }
        uStack_50 = 0x10bb90;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,299);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 7);
      sVar9 = (size_t)array.buffer[7];
      if (sVar9 == 0x30) {
        uStack_50 = 0x10bbbe;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,300);
        if (array.growStrategy != (ACUtilsGrowStrategy)0x0) {
          uStack_50 = 0x10bbdb;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x12d);
          uStack_50 = 0x10bbe4;
          (*(code *)CONCAT44(array.deallocator._4_4_,array.deallocator._0_4_))(array.buffer);
          return;
        }
        psVar5 = &local_58;
        pcVar4 = "Assertion \'_ck_x != NULL\' failed";
        pcVar3 = "Assertion \'%s\' failed: %s == %#x";
        pcVar7 = "(void*) array.growStrategy != NULL";
        pcVar8 = "(void*) array.growStrategy";
        iVar6 = 0x12d;
        goto LAB_0010bd82;
      }
      local_60 = "\'0\'";
      pcVar7 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
      pcVar3 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1] == \'0\'";
      pcVar4 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1]";
      iVar6 = 300;
      local_58 = 0x30;
      goto LAB_0010bc21;
    }
    pcVar3 = "array.capacity == private_ACUtilsTest_ADynArray_capacityMin";
    pcVar4 = "array.capacity";
    iVar6 = 0x128;
    sVar9 = array.capacity;
  }
  else {
    pcVar3 = "array.size == private_ACUtilsTest_ADynArray_capacityMin";
    pcVar4 = "array.size";
    iVar6 = 0x127;
    sVar9 = array.size;
  }
  local_60 = "private_ACUtilsTest_ADynArray_capacityMin";
  pcVar7 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  local_58 = 8;
LAB_0010bc21:
  uStack_50 = 0;
  local_68 = sVar9;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar6,"Assertion \'_ck_x == _ck_y\' failed",pcVar7,pcVar3,pcVar4);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_reserve_failure_noMemoryAvailable)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = private_ACUtilsTest_ADynArray_capacityMin;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax), false);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 1; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1], '0');
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    array.deallocator(array.buffer);
}